

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

void google::protobuf::compiler::java::EscapeUtf16ToString(uint16_t code,string *output)

{
  int iVar1;
  undefined6 in_register_0000003a;
  uint16_t local_42;
  string local_40;
  FormatSpec<unsigned_short> local_20;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,code);
  local_42 = code;
  switch(iVar1) {
  case 8:
    break;
  case 9:
    break;
  case 10:
    break;
  case 0xb:
switchD_00173855_caseD_b:
    if (0x5f < (ushort)(code - 0x20)) {
      local_20.super_type.spec_.data_ = "\\u%04x";
      local_20.super_type.spec_.size_ = 6;
      absl::lts_20250127::StrFormat<unsigned_short>(&local_40,&local_20,&local_42);
      std::__cxx11::string::append((string *)output);
      std::__cxx11::string::~string((string *)&local_40);
      return;
    }
    std::__cxx11::string::push_back((char)output);
    return;
  case 0xc:
    break;
  case 0xd:
    break;
  default:
    if (((iVar1 != 0x22) && (iVar1 != 0x27)) && (iVar1 != 0x5c)) goto switchD_00173855_caseD_b;
  }
  std::__cxx11::string::append((char *)output);
  return;
}

Assistant:

void EscapeUtf16ToString(uint16_t code, std::string* output) {
  if (code == '\t') {
    output->append("\\t");
  } else if (code == '\b') {
    output->append("\\b");
  } else if (code == '\n') {
    output->append("\\n");
  } else if (code == '\r') {
    output->append("\\r");
  } else if (code == '\f') {
    output->append("\\f");
  } else if (code == '\'') {
    output->append("\\'");
  } else if (code == '\"') {
    output->append("\\\"");
  } else if (code == '\\') {
    output->append("\\\\");
  } else if (code >= 0x20 && code <= 0x7f) {
    output->push_back(static_cast<char>(code));
  } else {
    output->append(absl::StrFormat("\\u%04x", code));
  }
}